

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Walker<Mapper,_wasm::Visitor<Mapper,_void>_>::walkFunctionInModule
          (Walker<Mapper,_wasm::Visitor<Mapper,_void>_> *this,Function *func,Module *module)

{
  Module *module_local;
  Function *func_local;
  Walker<Mapper,_wasm::Visitor<Mapper,_void>_> *this_local;
  
  setModule(this,module);
  setFunction(this,func);
  wasm::ModuleUtils::ParallelFunctionAnalysis<wasm::(anonymous_namespace)::TNHInfo,(wasm::
  Mutability)0,wasm::ModuleUtils::DefaultMap>::doAnalysis(std::function<void(wasm::Function*,wasm::
  (anonymous_namespace)::TNHInfo&)>)::Mapper::doWalkFunction(wasm::Function__
            (this[-1].stack.fixed._M_elems + 7,func);
  Visitor<Mapper,_void>::visitFunction((Visitor<Mapper,_void> *)this,func);
  setFunction(this,(Function *)0x0);
  setModule(this,(Module *)0x0);
  return;
}

Assistant:

void walkFunctionInModule(Function* func, Module* module) {
    setModule(module);
    setFunction(func);
    static_cast<SubType*>(this)->doWalkFunction(func);
    static_cast<SubType*>(this)->visitFunction(func);
    setFunction(nullptr);
    setModule(nullptr);
  }